

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int evthread_notify_base(event_base *base)

{
  int iVar1;
  event_base *base_local;
  
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar1 = evthread_is_debug_lock_held_(base->th_base_lock), iVar1 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0x9f2,"evthread_is_debug_lock_held_((base)->th_base_lock)","evthread_notify_base");
  }
  if (base->th_notify_fn == (_func_int_event_base_ptr *)0x0) {
    base_local._4_4_ = -1;
  }
  else if (base->is_notify_pending == 0) {
    base->is_notify_pending = 1;
    base_local._4_4_ = (*base->th_notify_fn)(base);
  }
  else {
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

static int
evthread_notify_base(struct event_base *base)
{
	EVENT_BASE_ASSERT_LOCKED(base);
	if (!base->th_notify_fn)
		return -1;
	if (base->is_notify_pending)
		return 0;
	base->is_notify_pending = 1;
	return base->th_notify_fn(base);
}